

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::ConfidentialTransactionController::GetSizeIgnoreTxIn
          (ConfidentialTransactionController *this,bool is_blinded,uint32_t *witness_area_size,
          uint32_t *no_witness_area_size,int exponent,int minimum_bits)

{
  bool bVar1;
  uint32_t uVar2;
  reference this_00;
  int *in_RCX;
  int *in_RDX;
  byte in_SIL;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  ConfidentialTxOutReference *txout;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  *__range1_1;
  uint32_t temp_no_witness_size;
  uint32_t temp_witness_size;
  uint32_t no_witness_size;
  uint32_t witness_size;
  ConfidentialTxInReference *txin;
  iterator __end1;
  iterator __begin1;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  *__range1;
  uint32_t temp_asset_count;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  txins;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  uint32_t size;
  ConfidentialTxInReference *in_stack_fffffffffffffed8;
  uint32_t in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  byte in_stack_fffffffffffffef4;
  undefined1 in_stack_fffffffffffffef5;
  byte in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  __normal_iterator<cfd::core::ConfidentialTxOutReference_*,_std::vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>_>
  local_f0;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  *local_e8;
  uint32_t local_e0;
  uint32_t local_dc;
  int local_d8;
  int local_d4;
  ByteData256 local_d0;
  ConfidentialValue local_b8;
  reference local_90;
  ConfidentialTxInReference *local_88;
  __normal_iterator<cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
  local_80;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  *local_78;
  uint32_t local_70;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  local_60;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_48;
  int local_2c;
  int local_28;
  int local_24;
  int *local_20;
  int *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_2c = 0xb;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  core::ConfidentialTransaction::GetTxOutList(&local_48,(ConfidentialTransaction *)(in_RDI + 0x10));
  core::ConfidentialTransaction::GetTxInList(&local_60,(ConfidentialTransaction *)(in_RDI + 0x10));
  local_70 = 0;
  local_78 = &local_60;
  local_80._M_current =
       (ConfidentialTxInReference *)
       std::
       vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
       ::begin(local_78);
  local_88 = (ConfidentialTxInReference *)
             std::
             vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             ::end(local_78);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                             *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            (__normal_iterator<cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                             *)in_stack_fffffffffffffed8), bVar1) {
    local_90 = __gnu_cxx::
               __normal_iterator<cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
               ::operator*(&local_80);
    core::ConfidentialTxInReference::GetIssuanceAmount(in_stack_fffffffffffffed8);
    in_stack_fffffffffffffef7 = core::ConfidentialValue::IsEmpty(&local_b8);
    in_stack_fffffffffffffef6 = in_stack_fffffffffffffef7 ^ 0xff;
    core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x586428);
    if ((in_stack_fffffffffffffef6 & 1) != 0) {
      local_70 = local_70 + 1;
      core::ConfidentialTxInReference::GetBlindingNonce(in_stack_fffffffffffffed8);
      in_stack_fffffffffffffef5 = core::ByteData256::IsEmpty(&local_d0);
      in_stack_fffffffffffffef4 = in_stack_fffffffffffffef5 ^ 0xff;
      core::ByteData256::~ByteData256((ByteData256 *)0x58647d);
      if ((in_stack_fffffffffffffef4 & 1) == 0) {
        local_70 = local_70 + 1;
      }
    }
    local_70 = local_70 + 1;
    __gnu_cxx::
    __normal_iterator<cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
    ::operator++(&local_80);
  }
  local_d4 = 0;
  local_d8 = 0;
  local_dc = 0;
  local_e0 = 0;
  local_e8 = &local_48;
  local_f0._M_current =
       (ConfidentialTxOutReference *)
       std::
       vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
       ::begin(local_e8);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::end(local_e8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<cfd::core::ConfidentialTxOutReference_*,_std::vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>_>
                             *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            (__normal_iterator<cfd::core::ConfidentialTxOutReference_*,_std::vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>_>
                             *)in_stack_fffffffffffffed8), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<cfd::core::ConfidentialTxOutReference_*,_std::vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>_>
              ::operator*(&local_f0);
    in_stack_fffffffffffffed8 = (ConfidentialTxInReference *)0x0;
    in_stack_fffffffffffffee0 = local_70;
    core::ConfidentialTxOutReference::GetSerializeSize
              (this_00,(bool)(local_9 & 1),&local_dc,&local_e0,local_24,local_28,(uint32_t *)0x0,
               local_70);
    local_d4 = local_dc + local_d4;
    local_d8 = local_e0 + local_d8;
    __gnu_cxx::
    __normal_iterator<cfd::core::ConfidentialTxOutReference_*,_std::vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>_>
    ::operator++(&local_f0);
  }
  local_2c = local_d8 + local_2c;
  if (local_18 != (int *)0x0) {
    *local_18 = local_d4 + *local_18;
  }
  if (local_20 != (int *)0x0) {
    *local_20 = local_2c + *local_20;
  }
  uVar2 = local_2c + local_d4;
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             *)CONCAT17(in_stack_fffffffffffffef7,
                        CONCAT16(in_stack_fffffffffffffef6,
                                 CONCAT15(in_stack_fffffffffffffef5,
                                          CONCAT14(in_stack_fffffffffffffef4,uVar2)))));
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             *)CONCAT17(in_stack_fffffffffffffef7,
                        CONCAT16(in_stack_fffffffffffffef6,
                                 CONCAT15(in_stack_fffffffffffffef5,
                                          CONCAT14(in_stack_fffffffffffffef4,uVar2)))));
  return uVar2;
}

Assistant:

uint32_t ConfidentialTransactionController::GetSizeIgnoreTxIn(
    bool is_blinded, uint32_t* witness_area_size,
    uint32_t* no_witness_area_size, int exponent, int minimum_bits) const {
  uint32_t size = ConfidentialTransaction::kElementsTransactionMinimumSize;
  std::vector<ConfidentialTxOutReference> txouts = transaction_.GetTxOutList();
  std::vector<ConfidentialTxInReference> txins = transaction_.GetTxInList();

  uint32_t temp_asset_count = 0;

  // search vin from issue/reissue
  for (const auto& txin : txins) {
    if (!txin.GetIssuanceAmount().IsEmpty()) {
      ++temp_asset_count;
      if (!txin.GetBlindingNonce().IsEmpty()) {
        // reissuance
      } else {
        ++temp_asset_count;  // issuance
      }
    }
    ++temp_asset_count;
  }

  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  uint32_t temp_witness_size = 0;
  uint32_t temp_no_witness_size = 0;
  for (const auto& txout : txouts) {
    txout.GetSerializeSize(
        is_blinded, &temp_witness_size, &temp_no_witness_size, exponent,
        minimum_bits, nullptr, temp_asset_count);
    witness_size += temp_witness_size;
    no_witness_size += temp_no_witness_size;
  }
  size += no_witness_size;

  if (witness_area_size != nullptr) {
    *witness_area_size += witness_size;
  }
  if (no_witness_area_size != nullptr) {
    *no_witness_area_size += size;
  }
  return size + witness_size;
}